

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O0

String * __thiscall sf::priv::ClipboardImpl::getStringImpl(ClipboardImpl *this)

{
  Int32 IVar1;
  long lVar2;
  undefined8 *in_RSI;
  String *in_RDI;
  Clock clock;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar3;
  String *in_stack_ffffffffffffffb0;
  String *this_00;
  Clock *this_01;
  Time local_20 [4];
  
  lVar2 = XGetSelectionOwner(in_RSI[1],in_RSI[2]);
  if (lVar2 == 0) {
    String::clear((String *)0x194646);
    String::String(in_stack_ffffffffffffffb0,
                   (String *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  }
  else {
    processEvents();
    *(undefined1 *)(in_RSI + 0x15) = 0;
    this_01 = (Clock *)in_RSI[1];
    if (in_RSI[5] == 0) {
      this_00 = (String *)0x1f;
    }
    else {
      this_00 = (String *)in_RSI[5];
    }
    XConvertSelection(this_01,in_RSI[2],this_00,in_RSI[6],*in_RSI,0);
    Clock::Clock((Clock *)this_00);
    while( true ) {
      uVar3 = false;
      if ((*(byte *)(in_RSI + 0x15) & 1) == 0) {
        local_20[0] = Clock::getElapsedTime(this_01);
        IVar1 = Time::asMilliseconds(local_20);
        uVar3 = IVar1 < 1000;
      }
      if ((bool)uVar3 == false) break;
      processEvents();
    }
    if ((*(byte *)(in_RSI + 0x15) & 1) == 0) {
      String::clear((String *)0x194739);
    }
    String::String(this_00,(String *)CONCAT17(uVar3,in_stack_ffffffffffffffa8));
  }
  return in_RDI;
}

Assistant:

String ClipboardImpl::getStringImpl()
{
    // Check if anybody owns the current selection
    if (XGetSelectionOwner(m_display, m_clipboard) == None)
    {
        m_clipboardContents.clear();

        return m_clipboardContents;
    }

    // Process any already pending events
    processEvents();

    m_requestResponded = false;

    // Request the current selection to be converted to UTF-8 (or STRING
    // if UTF-8 is not available) and written to our window property
    XConvertSelection(
        m_display,
        m_clipboard,
        (m_utf8String != None) ? m_utf8String : XA_STRING,
        m_targetProperty,
        m_window,
        CurrentTime
    );

    Clock clock;

    // Wait for a response for up to 1000ms
    while (!m_requestResponded && (clock.getElapsedTime().asMilliseconds() < 1000))
        processEvents();

    // If no response was received within the time period, clear our clipboard contents
    if (!m_requestResponded)
        m_clipboardContents.clear();

    return m_clipboardContents;
}